

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_quote(Curl_easy *data,_Bool init,ftpstate instate)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  long lVar5;
  undefined8 *puVar6;
  int iVar7;
  char *pcVar8;
  ftpstate newstate;
  int iVar9;
  bool bVar10;
  bool bVar11;
  
  lVar5 = 0x730;
  if ((byte)(instate - 0xd) < 3) {
    lVar5 = *(long *)(&DAT_00177fa0 + (ulong)(byte)(instate - 0xd) * 8);
  }
  pcVar1 = data->conn;
  puVar6 = *(undefined8 **)((long)&data->magic + lVar5);
  CVar3 = CURLE_OK;
  iVar7 = 0;
  if (!init) {
    iVar7 = (pcVar1->proto).ftpc.count1 + 1;
  }
  pFVar2 = (data->req).p.file;
  pp = &pcVar1->proto;
  (pcVar1->proto).ftpc.count1 = iVar7;
  if (puVar6 == (undefined8 *)0x0) {
    bVar10 = false;
  }
  else {
    iVar7 = (pcVar1->proto).ftpc.count1;
    bVar11 = true;
    if (iVar7 < 1) {
      bVar10 = true;
    }
    else {
      iVar9 = 1;
      do {
        puVar6 = (undefined8 *)puVar6[1];
        bVar10 = puVar6 != (undefined8 *)0x0;
        if (iVar7 <= iVar9) break;
        iVar9 = iVar9 + 1;
      } while (puVar6 != (undefined8 *)0x0);
    }
    if (bVar10) {
      pcVar8 = (char *)*puVar6;
      bVar10 = *pcVar8 == '*';
      *(uint *)((long)&pcVar1->proto + 0x104) = (uint)bVar10;
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s",pcVar8 + bVar10);
      bVar11 = CVar3 == CURLE_OK;
      bVar10 = bVar11;
      if (bVar11) {
        _ftp_state(data,instate);
      }
    }
    else {
      CVar3 = CURLE_OK;
      bVar10 = false;
    }
    if (!bVar11) {
      return CVar3;
    }
  }
  if (bVar10) {
    return CVar3;
  }
  if (instate == '\r') {
    if (pFVar2->fd == 0) {
      lVar5 = (pcVar1->proto).ftpc.known_filesize;
      if (lVar5 != -1) {
        Curl_pgrsSetDownloadSize(data,lVar5);
        CVar3 = ftp_state_retr(data,(pcVar1->proto).ftpc.known_filesize);
        return CVar3;
      }
      if ((((data->set).field_0x8ce & 2) == 0) && (((data->state).field_0x775 & 0x10) == 0)) {
        CVar3 = CURLE_OK;
        CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"SIZE %s",(pcVar1->proto).ftpc.file);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        newstate = '\x18';
      }
      else {
        CVar3 = CURLE_OK;
        CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(pcVar1->proto).ftpc.file);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        newstate = ' ';
      }
    }
    else {
      newstate = '\0';
    }
  }
  else {
    if (instate == '\x0e') {
      CVar3 = ftp_state_ul_setup(data,false);
      return CVar3;
    }
    if (instate == '\x0f') {
      return CVar3;
    }
    if ((*(byte *)((long)&pcVar1->proto + 0x112) & 8) != 0) {
LAB_0012adc1:
      CVar3 = ftp_state_mdtm(data);
      return CVar3;
    }
    (pcVar1->proto).ftpc.count2 = 0;
    if (((((ulong)pcVar1->bits & 0x40) == 0) ||
        (pcVar8 = (pcVar1->proto).ftpc.entrypath, pcVar8 == (char *)0x0)) ||
       (((pcVar1->proto).ftpc.dirdepth != 0 && (**(pcVar1->proto).ftpc.dirs == '/')))) {
      if ((pcVar1->proto).ftpc.dirdepth == 0) goto LAB_0012adc1;
      (pcVar1->proto).ftpc.cwdcount = 1;
      pcVar8 = *(pcVar1->proto).ftpc.dirs;
    }
    else {
      (pcVar1->proto).ftpc.cwdcount = 0;
    }
    CVar3 = CURLE_OK;
    CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"CWD %s",pcVar8);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    newstate = '\x10';
  }
  _ftp_state(data,newstate);
  return CVar3;
}

Assistant:

static CURLcode ftp_state_quote(struct Curl_easy *data,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i < ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s", cmd);
      if(result)
        return result;
      ftp_state(data, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(data, conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != PPTRANSFER_BODY)
        ftp_state(data, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(data, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl || data->state.prefer_ascii) {
            /* 'ignorecl' is used to support download of growing files. It
               prevents the state machine from requesting the file size from
               the server. With an unknown file size the download continues
               until the server terminates it, otherwise the client stops if
               the received byte count exceeds the reported file size. Set
               option CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this
               behavior.

               In addition: asking for the size for 'TYPE A' transfers is not
               constructive since servers do not report the converted size. So
               skip it.
            */
            result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR);
          }
          else {
            result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(data, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}